

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t argumentNode,
          sysbvm_tuple_t *activationEnvironment)

{
  anon_struct_16_2_26fdac2c gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_tuple_t *local_30;
  
  local_30 = &local_70;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  local_70 = argumentNode;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_70 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  if (*(sysbvm_tuple_t *)(local_70 + 0x38) != 0) {
    local_68 = sysbvm_interpreter_evaluateASTWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_70 + 0x38),*activationEnvironment);
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(sysbvm_context_t *context, sysbvm_tuple_t argumentNode, sysbvm_tuple_t *activationEnvironment)
{
    struct {
        sysbvm_astArgumentNode_t *argumentNode;
        sysbvm_tuple_t expectedType;
    } gcFrame = {
        .argumentNode = (sysbvm_astArgumentNode_t*)argumentNode,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.argumentNode->super.sourcePosition);

    if(gcFrame.argumentNode->type)
        gcFrame.expectedType = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode->type, *activationEnvironment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.expectedType;
}